

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_calc_sasl_details
                   (connectdata *conn,char **mech,char **initresp,size_t *len,smtpstate *state1,
                   smtpstate *state2)

{
  uint uVar1;
  int iVar2;
  SessionHandle *data;
  CURLcode CVar3;
  
  data = conn->data;
  uVar1 = (conn->proto).imapc.prefmech;
  if (((uVar1 & 8) == 0) || ((*(byte *)((long)&conn->proto + 0x84) & 8) == 0)) {
    if (((uVar1 & 4) == 0) || ((*(byte *)((long)&conn->proto + 0x84) & 4) == 0)) {
      if ((((char)uVar1 < '\0') &&
          (iVar2 = (conn->proto).ftpc.diralloc, iVar2 != -1 && (char)iVar2 < '\0')) ||
         (conn->xoauth2_bearer != (char *)0x0)) {
        *mech = "XOAUTH2";
        *state1 = SMTP_AUTH_XOAUTH2;
        *state2 = SMTP_AUTH_FINAL;
        (conn->proto).imapc.cmdid = 0x80;
        if ((data->set).sasl_ir == true) {
          CVar3 = Curl_sasl_create_xoauth2_message
                            (data,conn->user,conn->xoauth2_bearer,initresp,len);
          return CVar3;
        }
      }
      else if (((uVar1 & 1) == 0) || ((*(byte *)((long)&conn->proto + 0x84) & 1) == 0)) {
        if (((uVar1 & 2) != 0) && ((*(byte *)((long)&conn->proto + 0x84) & 2) != 0)) {
          *mech = "PLAIN";
          *state1 = SMTP_AUTH_PLAIN;
          *state2 = SMTP_AUTH_FINAL;
          (conn->proto).imapc.cmdid = 2;
          if ((data->set).sasl_ir == true) {
            CVar3 = Curl_sasl_create_plain_message(data,conn->user,conn->passwd,initresp,len);
            return CVar3;
          }
        }
      }
      else {
        *mech = "LOGIN";
        *state1 = SMTP_AUTH_LOGIN;
        *state2 = SMTP_AUTH_LOGIN_PASSWD;
        (conn->proto).imapc.cmdid = 1;
        if ((data->set).sasl_ir == true) {
          CVar3 = Curl_sasl_create_login_message(data,conn->user,initresp,len);
          return CVar3;
        }
      }
    }
    else {
      *mech = "CRAM-MD5";
      *state1 = SMTP_AUTH_CRAMMD5;
      (conn->proto).imapc.cmdid = 4;
    }
  }
  else {
    *mech = "DIGEST-MD5";
    *state1 = SMTP_AUTH_DIGESTMD5;
    (conn->proto).imapc.cmdid = 8;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_calc_sasl_details(struct connectdata *conn,
                                       const char **mech,
                                       char **initresp, size_t *len,
                                       smtpstate *state1, smtpstate *state2)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
#if defined(USE_WINDOWS_SSPI)
  if((smtpc->authmechs & SASL_MECH_GSSAPI) &&
     (smtpc->prefmech & SASL_MECH_GSSAPI)) {
    smtpc->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */

    *mech = SASL_MECH_STRING_GSSAPI;
    *state1 = SMTP_AUTH_GSSAPI;
    *state2 = SMTP_AUTH_GSSAPI_TOKEN;
    smtpc->authused = SASL_MECH_GSSAPI;

    if(data->set.sasl_ir)
      result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                    conn->passwd, "smtp",
                                                    smtpc->mutual_auth,
                                                    NULL, &conn->krb5,
                                                    initresp, len);
    }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if((smtpc->authmechs & SASL_MECH_DIGEST_MD5) &&
     (smtpc->prefmech & SASL_MECH_DIGEST_MD5)) {
    *mech = SASL_MECH_STRING_DIGEST_MD5;
    *state1 = SMTP_AUTH_DIGESTMD5;
    smtpc->authused = SASL_MECH_DIGEST_MD5;
  }
  else if((smtpc->authmechs & SASL_MECH_CRAM_MD5) &&
          (smtpc->prefmech & SASL_MECH_CRAM_MD5)) {
    *mech = SASL_MECH_STRING_CRAM_MD5;
    *state1 = SMTP_AUTH_CRAMMD5;
    smtpc->authused = SASL_MECH_CRAM_MD5;
  }
  else
#endif
#ifdef USE_NTLM
  if((smtpc->authmechs & SASL_MECH_NTLM) &&
     (smtpc->prefmech & SASL_MECH_NTLM)) {
    *mech = SASL_MECH_STRING_NTLM;
    *state1 = SMTP_AUTH_NTLM;
    *state2 = SMTP_AUTH_NTLM_TYPE2MSG;
    smtpc->authused = SASL_MECH_NTLM;

    if(data->set.sasl_ir)
      result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                   &conn->ntlm,
                                                   initresp, len);
    }
  else
#endif
  if(((smtpc->authmechs & SASL_MECH_XOAUTH2) &&
      (smtpc->prefmech & SASL_MECH_XOAUTH2) &&
      (smtpc->prefmech != SASL_AUTH_ANY)) || conn->xoauth2_bearer) {
    *mech = SASL_MECH_STRING_XOAUTH2;
    *state1 = SMTP_AUTH_XOAUTH2;
    *state2 = SMTP_AUTH_FINAL;
    smtpc->authused = SASL_MECH_XOAUTH2;

    if(data->set.sasl_ir)
      result = Curl_sasl_create_xoauth2_message(data, conn->user,
                                                conn->xoauth2_bearer,
                                                initresp, len);
  }
  else if((smtpc->authmechs & SASL_MECH_LOGIN) &&
          (smtpc->prefmech & SASL_MECH_LOGIN)) {
    *mech = SASL_MECH_STRING_LOGIN;
    *state1 = SMTP_AUTH_LOGIN;
    *state2 = SMTP_AUTH_LOGIN_PASSWD;
    smtpc->authused = SASL_MECH_LOGIN;

    if(data->set.sasl_ir)
      result = Curl_sasl_create_login_message(data, conn->user, initresp, len);
  }
  else if((smtpc->authmechs & SASL_MECH_PLAIN) &&
          (smtpc->prefmech & SASL_MECH_PLAIN)) {
    *mech = SASL_MECH_STRING_PLAIN;
    *state1 = SMTP_AUTH_PLAIN;
    *state2 = SMTP_AUTH_FINAL;
    smtpc->authused = SASL_MECH_PLAIN;

    if(data->set.sasl_ir)
      result = Curl_sasl_create_plain_message(data, conn->user, conn->passwd,
                                              initresp, len);
  }

  return result;
}